

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void save_as_do_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_String filename;
  Am_String default_file_name;
  Am_String local_30;
  Am_Object local_28;
  Am_String local_20;
  Am_Object local_18;
  
  get_default_filename(&local_18);
  Am_String::Am_String(&local_20,(Am_String *)&local_18);
  Am_Show_File_Dialog_For_Save(&local_30);
  Am_String::~Am_String(&local_20);
  bVar1 = Am_String::Valid(&local_30);
  if (bVar1) {
    bVar1 = Am_String::operator==(&local_30,"");
    if (!bVar1) {
      Am_Object::Am_Object(&local_28,command_obj);
      internal_do_save(&local_28,&local_30);
      Am_Object::~Am_Object(&local_28);
    }
  }
  Am_String::~Am_String(&local_30);
  Am_String::~Am_String((Am_String *)&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, save_as_do, (Am_Object command_obj))
{
  Am_String default_file_name = get_default_filename(command_obj);
  Am_String filename = Am_Show_File_Dialog_For_Save(default_file_name);
  if (!filename.Valid() || filename == "")
    return;
  internal_do_save(command_obj, filename);
}